

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O0

void highbd_interpolate(uint16_t *input,int in_length,uint16_t *output,int out_length,int bd)

{
  int in_ECX;
  int in_ESI;
  InterpKernel *interp_filters;
  int16_t *in_stack_00000090;
  int in_stack_00000098;
  int in_stack_0000009c;
  uint16_t *in_stack_000000a0;
  int in_stack_000000ac;
  uint16_t *in_stack_000000b0;
  int in_stack_000000c0;
  
  choose_interp_filter(in_ESI,in_ECX);
  highbd_interpolate_core
            (in_stack_000000b0,in_stack_000000ac,in_stack_000000a0,in_stack_0000009c,
             in_stack_00000098,in_stack_00000090,in_stack_000000c0);
  return;
}

Assistant:

static void highbd_interpolate(const uint16_t *const input, int in_length,
                               uint16_t *output, int out_length, int bd) {
  const InterpKernel *interp_filters =
      choose_interp_filter(in_length, out_length);

  highbd_interpolate_core(input, in_length, output, out_length, bd,
                          &interp_filters[0][0], SUBPEL_TAPS);
}